

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

GLFWbool waitForVisibilityNotify(_GLFWwindow *window)

{
  int iVar1;
  GLFWbool GVar2;
  double timeout;
  XEvent dummy;
  double local_e8;
  XEvent local_e0;
  
  local_e8 = 0.1;
  do {
    iVar1 = (*_glfw.x11.xlib.CheckTypedWindowEvent)
                      (_glfw.x11.display,(window->x11).handle,0xf,&local_e0);
    if (iVar1 != 0) {
      return iVar1;
    }
    GVar2 = waitForX11Event(&local_e8);
  } while (GVar2 != 0);
  return 0;
}

Assistant:

static GLFWbool waitForVisibilityNotify(_GLFWwindow* window)
{
    XEvent dummy;
    double timeout = 0.1;

    while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                   window->x11.handle,
                                   VisibilityNotify,
                                   &dummy))
    {
        if (!waitForX11Event(&timeout))
            return GLFW_FALSE;
    }

    return GLFW_TRUE;
}